

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

bool __thiscall libtorrent::aux::torrent::is_inactive_internal(torrent *this)

{
  int iVar1;
  _func_int *p_Var2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unique_lock<std::mutex> local_28;
  
  bVar3 = is_finished(this);
  p_Var2 = (((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
           [0x2e];
  if (bVar3) {
    iVar1 = *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0xc
    ;
    iVar4 = (*p_Var2)();
    local_28._M_device = (mutex_type *)(CONCAT44(extraout_var,iVar4) + 0x438);
    local_28._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(&local_28);
    iVar4 = *(int *)(CONCAT44(extraout_var,iVar4) + 0x390);
    bVar3 = SBORROW4(iVar1,iVar4);
    iVar1 = iVar1 - iVar4;
  }
  else {
    iVar1 = *(int *)&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.
                     field_0x2c;
    iVar4 = (*p_Var2)();
    local_28._M_device = (mutex_type *)(CONCAT44(extraout_var_00,iVar4) + 0x438);
    local_28._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(&local_28);
    iVar4 = *(int *)(CONCAT44(extraout_var_00,iVar4) + 0x38c);
    bVar3 = SBORROW4(iVar1,iVar4);
    iVar1 = iVar1 - iVar4;
  }
  local_28._M_owns = true;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return bVar3 != iVar1 < 0;
}

Assistant:

bool torrent::is_inactive_internal() const
	{
		if (is_finished())
			return m_stat.upload_payload_rate()
				< settings().get_int(settings_pack::inactive_up_rate);
		else
			return m_stat.download_payload_rate()
				< settings().get_int(settings_pack::inactive_down_rate);
	}